

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::Rollup::CreateDiffModeRollupOutput
          (Rollup *this,Rollup *base,Options *options,RollupOutput *output)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  
  lVar1 = this->vm_total_;
  lVar2 = this->file_total_;
  (output->toplevel_row_).size.vm = lVar1;
  (output->toplevel_row_).size.file = lVar2;
  iVar4 = this->filtered_file_total_;
  (output->toplevel_row_).filtered_size.vm = this->filtered_vm_total_;
  (output->toplevel_row_).filtered_size.file = iVar4;
  (output->toplevel_row_).vmpercent = 100.0;
  (output->toplevel_row_).filepercent = 100.0;
  if (base != (Rollup *)0x0) {
    lVar3 = base->file_total_;
    (output->toplevel_row_).size.vm = lVar1 - base->vm_total_;
    (output->toplevel_row_).size.file = lVar2 - lVar3;
  }
  output->diff_mode_ = true;
  CreateRows(this,&output->toplevel_row_,base,options,true);
  return;
}

Assistant:

void CreateDiffModeRollupOutput(Rollup* base, const Options& options,
                                  RollupOutput* output) const {
    RollupRow* row = &output->toplevel_row_;
    row->size.vm = vm_total_;
    row->size.file = file_total_;
    row->filtered_size.vm = filtered_vm_total_;
    row->filtered_size.file = filtered_file_total_;
    row->vmpercent = 100;
    row->filepercent = 100;
    if (base) {
      row->size.vm -= base->vm_total_;
      row->size.file -= base->file_total_;
    }
    output->diff_mode_ = true;
    CreateRows(row, base, options, true);
  }